

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int remux_tiles(CommonTileParams *tiles,uint8_t *dst,uint32_t data_size,uint32_t max_tile_size,
               uint32_t max_tile_col_size,int *tile_size_bytes,int *tile_col_size_bytes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint32_t in_ECX;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  uint32_t in_R8D;
  int *in_R9;
  int *in_stack_00000008;
  int tile_size;
  int n;
  int n_tiles;
  uint32_t tile_header;
  uint32_t tile_col_size;
  int tile_col;
  int tile_row;
  uint32_t rpos;
  uint32_t wpos;
  int tcsb;
  int tsb;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  uint local_4;
  
  if (in_RDI[0x91] == 0) {
    local_34 = choose_size_bytes(in_ECX,0);
    local_38 = 4;
  }
  else {
    local_34 = choose_size_bytes(in_ECX,1);
    local_38 = choose_size_bytes(in_R8D,0);
  }
  *in_R9 = local_34;
  *in_stack_00000008 = local_38;
  if ((local_34 != 4) || (local_4 = in_EDX, local_38 != 4)) {
    local_3c = 0;
    local_40 = 0;
    if (in_RDI[0x91] == 0) {
      iVar1 = *in_RDI;
      iVar2 = in_RDI[1];
      for (local_58 = 0; local_58 < iVar1 * iVar2; local_58 = local_58 + 1) {
        if (local_58 == iVar1 * iVar2 + -1) {
          iVar4 = in_EDX - local_40;
        }
        else {
          uVar3 = mem_get_le32_as_int((void *)(in_RSI + (ulong)local_40));
          local_40 = local_40 + 4;
          mem_put_varsize((uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
          iVar4 = uVar3 + 1;
          local_3c = local_34 + local_3c;
        }
        memmove((void *)(in_RSI + (ulong)local_3c),(void *)(in_RSI + (ulong)local_40),(long)iVar4);
        local_40 = iVar4 + local_40;
        local_3c = iVar4 + local_3c;
      }
      local_4 = local_3c;
    }
    else {
      for (local_48 = 0; local_48 < *in_RDI; local_48 = local_48 + 1) {
        if (local_48 < *in_RDI + -1) {
          mem_get_le32_as_int((void *)(in_RSI + (ulong)local_40));
          local_40 = local_40 + 4;
          mem_put_varsize((uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
          local_3c = local_38 + local_3c;
        }
        for (local_44 = 0; local_44 < in_RDI[1]; local_44 = local_44 + 1) {
          uVar3 = mem_get_le32_as_int((void *)(in_RSI + (ulong)local_40));
          local_40 = local_40 + 4;
          if ((int)uVar3 < 0) {
            mem_put_varsize((uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                            ,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
            local_3c = local_34 + local_3c;
          }
          else {
            mem_put_varsize((uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                            ,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
            uVar3 = uVar3 + 1;
            memmove((void *)(in_RSI + (ulong)(local_34 + local_3c)),
                    (void *)(in_RSI + (ulong)local_40),(ulong)uVar3);
            local_40 = uVar3 + local_40;
            local_3c = uVar3 + local_34 + local_3c;
          }
        }
      }
      local_4 = local_3c;
    }
  }
  return local_4;
}

Assistant:

static int remux_tiles(const CommonTileParams *const tiles, uint8_t *dst,
                       const uint32_t data_size, const uint32_t max_tile_size,
                       const uint32_t max_tile_col_size,
                       int *const tile_size_bytes,
                       int *const tile_col_size_bytes) {
  // Choose the tile size bytes (tsb) and tile column size bytes (tcsb)
  int tsb;
  int tcsb;

  if (tiles->large_scale) {
    // The top bit in the tile size field indicates tile copy mode, so we
    // have 1 less bit to code the tile size
    tsb = choose_size_bytes(max_tile_size, 1);
    tcsb = choose_size_bytes(max_tile_col_size, 0);
  } else {
    tsb = choose_size_bytes(max_tile_size, 0);
    tcsb = 4;  // This is ignored
    (void)max_tile_col_size;
  }

  assert(tsb > 0);
  assert(tcsb > 0);

  *tile_size_bytes = tsb;
  *tile_col_size_bytes = tcsb;
  if (tsb == 4 && tcsb == 4) return data_size;

  uint32_t wpos = 0;
  uint32_t rpos = 0;

  if (tiles->large_scale) {
    int tile_row;
    int tile_col;

    for (tile_col = 0; tile_col < tiles->cols; tile_col++) {
      // All but the last column has a column header
      if (tile_col < tiles->cols - 1) {
        uint32_t tile_col_size = mem_get_le32(dst + rpos);
        rpos += 4;

        // Adjust the tile column size by the number of bytes removed
        // from the tile size fields.
        tile_col_size -= (4 - tsb) * tiles->rows;

        mem_put_varsize(dst + wpos, tcsb, tile_col_size);
        wpos += tcsb;
      }

      for (tile_row = 0; tile_row < tiles->rows; tile_row++) {
        // All, including the last row has a header
        uint32_t tile_header = mem_get_le32(dst + rpos);
        rpos += 4;

        // If this is a copy tile, we need to shift the MSB to the
        // top bit of the new width, and there is no data to copy.
        if (tile_header >> 31 != 0) {
          if (tsb < 4) tile_header >>= 32 - 8 * tsb;
          mem_put_varsize(dst + wpos, tsb, tile_header);
          wpos += tsb;
        } else {
          mem_put_varsize(dst + wpos, tsb, tile_header);
          wpos += tsb;

          tile_header += AV1_MIN_TILE_SIZE_BYTES;
          memmove(dst + wpos, dst + rpos, tile_header);
          rpos += tile_header;
          wpos += tile_header;
        }
      }
    }

    assert(rpos > wpos);
    assert(rpos == data_size);

    return wpos;
  }
  const int n_tiles = tiles->cols * tiles->rows;
  int n;

  for (n = 0; n < n_tiles; n++) {
    int tile_size;

    if (n == n_tiles - 1) {
      tile_size = data_size - rpos;
    } else {
      tile_size = mem_get_le32(dst + rpos);
      rpos += 4;
      mem_put_varsize(dst + wpos, tsb, tile_size);
      tile_size += AV1_MIN_TILE_SIZE_BYTES;
      wpos += tsb;
    }

    memmove(dst + wpos, dst + rpos, tile_size);

    rpos += tile_size;
    wpos += tile_size;
  }

  assert(rpos > wpos);
  assert(rpos == data_size);

  return wpos;
}